

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_short>::rayTest
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *rayFrom,btVector3 *rayTo,
          btBroadphaseRayCallback *rayCallback,btVector3 *aabbMin,btVector3 *aabbMax)

{
  unsigned_short uVar1;
  Handle *pHVar2;
  long *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  btAxisSweep3Internal<unsigned_short> *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  unsigned_short i;
  unsigned_short axis;
  ushort local_34;
  
  if (in_RDI->m_raycastAccelerator == (btDbvtBroadphase *)0x0) {
    for (local_34 = 1; (uint)local_34 < (uint)in_RDI->m_numHandles * 2 + 1; local_34 = local_34 + 1)
    {
      uVar1 = Edge::IsMax(in_RDI->m_pEdges[0] + local_34);
      if (uVar1 != 0) {
        pHVar2 = getHandle(in_RDI,in_RDI->m_pEdges[0][local_34].m_handle);
        (**(code **)(*in_RCX + 0x10))(in_RCX,pHVar2);
      }
    }
  }
  else {
    (*(in_RDI->m_raycastAccelerator->super_btBroadphaseInterface)._vptr_btBroadphaseInterface[6])
              (in_RDI->m_raycastAccelerator,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::rayTest(const btVector3& rayFrom,const btVector3& rayTo, btBroadphaseRayCallback& rayCallback,const btVector3& aabbMin,const btVector3& aabbMax)
{
	if (m_raycastAccelerator)
	{
		m_raycastAccelerator->rayTest(rayFrom,rayTo,rayCallback,aabbMin,aabbMax);
	} else
	{
		//choose axis?
		BP_FP_INT_TYPE axis = 0;
		//for each proxy
		for (BP_FP_INT_TYPE i=1;i<m_numHandles*2+1;i++)
		{
			if (m_pEdges[axis][i].IsMax())
			{
				rayCallback.process(getHandle(m_pEdges[axis][i].m_handle));
			}
		}
	}
}